

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void Transform(uint64_t *s,uint64_t *chunk)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  uint64_t uVar24;
  uint64_t w15;
  uint64_t w14;
  uint64_t w13;
  uint64_t w12;
  uint64_t w11;
  uint64_t w10;
  uint64_t w9;
  uint64_t w8;
  uint64_t w7;
  uint64_t w6;
  uint64_t w5;
  uint64_t w4;
  uint64_t w3;
  uint64_t w2;
  uint64_t w1;
  uint64_t w0;
  uint64_t h;
  uint64_t g;
  uint64_t f;
  uint64_t e;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t *chunk_local;
  uint64_t *s_local;
  
  uVar1 = *s;
  uVar2 = s[1];
  uVar3 = s[2];
  e = s[3];
  uVar4 = s[4];
  uVar5 = s[5];
  uVar6 = s[6];
  w0 = s[7];
  h = uVar6;
  g = uVar5;
  f = uVar4;
  d = uVar3;
  c = uVar2;
  b = uVar1;
  a = (uint64_t)chunk;
  chunk_local = s;
  uVar7 = be64_to_cpu(*chunk);
  Round(uVar1,uVar2,uVar3,&e,uVar4,uVar5,uVar6,&w0,0x428a2f98d728ae22,uVar7);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar8 = be64_to_cpu(*(beint64_t *)(a + 8));
  Round(uVar1,uVar6,uVar5,&d,uVar4,uVar3,uVar2,&h,0x7137449123ef65cd,uVar8);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar9 = be64_to_cpu(*(beint64_t *)(a + 0x10));
  Round(uVar2,uVar1,uVar6,&c,uVar5,uVar4,uVar3,&g,0xb5c0fbcfec4d3b2f,uVar9);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar10 = be64_to_cpu(*(beint64_t *)(a + 0x18));
  Round(uVar3,uVar2,uVar1,&b,uVar6,uVar5,uVar4,&f,0xe9b5dba58189dbbc,uVar10);
  uVar6 = b;
  uVar5 = c;
  uVar4 = d;
  uVar3 = f;
  uVar2 = g;
  uVar1 = h;
  uVar11 = be64_to_cpu(*(beint64_t *)(a + 0x20));
  Round(uVar3,uVar2,uVar1,&w0,uVar6,uVar5,uVar4,&e,0x3956c25bf348b538,uVar11);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar12 = be64_to_cpu(*(beint64_t *)(a + 0x28));
  Round(uVar4,uVar3,uVar2,&h,uVar1,uVar6,uVar5,&d,0x59f111f1b605d019,uVar12);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar13 = be64_to_cpu(*(beint64_t *)(a + 0x30));
  Round(uVar5,uVar4,uVar3,&g,uVar2,uVar1,uVar6,&c,0x923f82a4af194f9b,uVar13);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar14 = be64_to_cpu(*(beint64_t *)(a + 0x38));
  Round(uVar6,uVar5,uVar4,&f,uVar3,uVar2,uVar1,&b,0xab1c5ed5da6d8118,uVar14);
  uVar6 = b;
  uVar5 = c;
  uVar4 = d;
  uVar3 = f;
  uVar2 = g;
  uVar1 = h;
  uVar15 = be64_to_cpu(*(beint64_t *)(a + 0x40));
  Round(uVar6,uVar5,uVar4,&e,uVar3,uVar2,uVar1,&w0,0xd807aa98a3030242,uVar15);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar16 = be64_to_cpu(*(beint64_t *)(a + 0x48));
  Round(uVar1,uVar6,uVar5,&d,uVar4,uVar3,uVar2,&h,0x12835b0145706fbe,uVar16);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar17 = be64_to_cpu(*(beint64_t *)(a + 0x50));
  Round(uVar2,uVar1,uVar6,&c,uVar5,uVar4,uVar3,&g,0x243185be4ee4b28c,uVar17);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar18 = be64_to_cpu(*(beint64_t *)(a + 0x58));
  Round(uVar3,uVar2,uVar1,&b,uVar6,uVar5,uVar4,&f,0x550c7dc3d5ffb4e2,uVar18);
  uVar6 = b;
  uVar5 = c;
  uVar4 = d;
  uVar3 = f;
  uVar2 = g;
  uVar1 = h;
  uVar19 = be64_to_cpu(*(beint64_t *)(a + 0x60));
  Round(uVar3,uVar2,uVar1,&w0,uVar6,uVar5,uVar4,&e,0x72be5d74f27b896f,uVar19);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar20 = be64_to_cpu(*(beint64_t *)(a + 0x68));
  Round(uVar4,uVar3,uVar2,&h,uVar1,uVar6,uVar5,&d,0x80deb1fe3b1696b1,uVar20);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar21 = be64_to_cpu(*(beint64_t *)(a + 0x70));
  Round(uVar5,uVar4,uVar3,&g,uVar2,uVar1,uVar6,&c,0x9bdc06a725c71235,uVar21);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar22 = be64_to_cpu(*(beint64_t *)(a + 0x78));
  Round(uVar6,uVar5,uVar4,&f,uVar3,uVar2,uVar1,&b,0xc19bf174cf692694,uVar22);
  uVar6 = b;
  uVar5 = c;
  uVar4 = d;
  uVar3 = f;
  uVar2 = g;
  uVar1 = h;
  uVar23 = sigma1(uVar21);
  uVar24 = sigma0(uVar8);
  uVar7 = uVar23 + uVar16 + uVar24 + uVar7;
  Round(uVar6,uVar5,uVar4,&e,uVar3,uVar2,uVar1,&w0,0xe49b69c19ef14ad2,uVar7);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar23 = sigma1(uVar22);
  uVar24 = sigma0(uVar9);
  uVar8 = uVar23 + uVar17 + uVar24 + uVar8;
  Round(uVar1,uVar6,uVar5,&d,uVar4,uVar3,uVar2,&h,0xefbe4786384f25e3,uVar8);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar7);
  uVar24 = sigma0(uVar10);
  uVar9 = uVar23 + uVar18 + uVar24 + uVar9;
  Round(uVar2,uVar1,uVar6,&c,uVar5,uVar4,uVar3,&g,0xfc19dc68b8cd5b5,uVar9);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar8);
  uVar24 = sigma0(uVar11);
  uVar10 = uVar23 + uVar19 + uVar24 + uVar10;
  Round(uVar3,uVar2,uVar1,&b,uVar6,uVar5,uVar4,&f,0x240ca1cc77ac9c65,uVar10);
  uVar6 = b;
  uVar5 = c;
  uVar4 = d;
  uVar3 = f;
  uVar2 = g;
  uVar1 = h;
  uVar23 = sigma1(uVar9);
  uVar24 = sigma0(uVar12);
  uVar11 = uVar23 + uVar20 + uVar24 + uVar11;
  Round(uVar3,uVar2,uVar1,&w0,uVar6,uVar5,uVar4,&e,0x2de92c6f592b0275,uVar11);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar23 = sigma1(uVar10);
  uVar24 = sigma0(uVar13);
  uVar12 = uVar23 + uVar21 + uVar24 + uVar12;
  Round(uVar4,uVar3,uVar2,&h,uVar1,uVar6,uVar5,&d,0x4a7484aa6ea6e483,uVar12);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar11);
  uVar24 = sigma0(uVar14);
  uVar13 = uVar23 + uVar22 + uVar24 + uVar13;
  Round(uVar5,uVar4,uVar3,&g,uVar2,uVar1,uVar6,&c,0x5cb0a9dcbd41fbd4,uVar13);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar12);
  uVar24 = sigma0(uVar15);
  uVar14 = uVar23 + uVar7 + uVar24 + uVar14;
  Round(uVar6,uVar5,uVar4,&f,uVar3,uVar2,uVar1,&b,0x76f988da831153b5,uVar14);
  uVar6 = b;
  uVar5 = c;
  uVar4 = d;
  uVar3 = f;
  uVar2 = g;
  uVar1 = h;
  uVar23 = sigma1(uVar13);
  uVar24 = sigma0(uVar16);
  uVar15 = uVar23 + uVar8 + uVar24 + uVar15;
  Round(uVar6,uVar5,uVar4,&e,uVar3,uVar2,uVar1,&w0,0x983e5152ee66dfab,uVar15);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar23 = sigma1(uVar14);
  uVar24 = sigma0(uVar17);
  uVar16 = uVar23 + uVar9 + uVar24 + uVar16;
  Round(uVar1,uVar6,uVar5,&d,uVar4,uVar3,uVar2,&h,0xa831c66d2db43210,uVar16);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar15);
  uVar24 = sigma0(uVar18);
  uVar17 = uVar23 + uVar10 + uVar24 + uVar17;
  Round(uVar2,uVar1,uVar6,&c,uVar5,uVar4,uVar3,&g,0xb00327c898fb213f,uVar17);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar16);
  uVar24 = sigma0(uVar19);
  uVar18 = uVar23 + uVar11 + uVar24 + uVar18;
  Round(uVar3,uVar2,uVar1,&b,uVar6,uVar5,uVar4,&f,0xbf597fc7beef0ee4,uVar18);
  uVar6 = b;
  uVar5 = c;
  uVar4 = d;
  uVar3 = f;
  uVar2 = g;
  uVar1 = h;
  uVar23 = sigma1(uVar17);
  uVar24 = sigma0(uVar20);
  uVar19 = uVar23 + uVar12 + uVar24 + uVar19;
  Round(uVar3,uVar2,uVar1,&w0,uVar6,uVar5,uVar4,&e,0xc6e00bf33da88fc2,uVar19);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar23 = sigma1(uVar18);
  uVar24 = sigma0(uVar21);
  uVar20 = uVar23 + uVar13 + uVar24 + uVar20;
  Round(uVar4,uVar3,uVar2,&h,uVar1,uVar6,uVar5,&d,0xd5a79147930aa725,uVar20);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar19);
  uVar24 = sigma0(uVar22);
  uVar21 = uVar23 + uVar14 + uVar24 + uVar21;
  Round(uVar5,uVar4,uVar3,&g,uVar2,uVar1,uVar6,&c,0x6ca6351e003826f,uVar21);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar20);
  uVar24 = sigma0(uVar7);
  uVar22 = uVar23 + uVar15 + uVar24 + uVar22;
  Round(uVar6,uVar5,uVar4,&f,uVar3,uVar2,uVar1,&b,0x142929670a0e6e70,uVar22);
  uVar6 = b;
  uVar5 = c;
  uVar4 = d;
  uVar3 = f;
  uVar2 = g;
  uVar1 = h;
  uVar23 = sigma1(uVar21);
  uVar24 = sigma0(uVar8);
  uVar7 = uVar23 + uVar16 + uVar24 + uVar7;
  Round(uVar6,uVar5,uVar4,&e,uVar3,uVar2,uVar1,&w0,0x27b70a8546d22ffc,uVar7);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar23 = sigma1(uVar22);
  uVar24 = sigma0(uVar9);
  uVar8 = uVar23 + uVar17 + uVar24 + uVar8;
  Round(uVar1,uVar6,uVar5,&d,uVar4,uVar3,uVar2,&h,0x2e1b21385c26c926,uVar8);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar7);
  uVar24 = sigma0(uVar10);
  uVar9 = uVar23 + uVar18 + uVar24 + uVar9;
  Round(uVar2,uVar1,uVar6,&c,uVar5,uVar4,uVar3,&g,0x4d2c6dfc5ac42aed,uVar9);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar8);
  uVar24 = sigma0(uVar11);
  uVar10 = uVar23 + uVar19 + uVar24 + uVar10;
  Round(uVar3,uVar2,uVar1,&b,uVar6,uVar5,uVar4,&f,0x53380d139d95b3df,uVar10);
  uVar6 = b;
  uVar5 = c;
  uVar4 = d;
  uVar3 = f;
  uVar2 = g;
  uVar1 = h;
  uVar23 = sigma1(uVar9);
  uVar24 = sigma0(uVar12);
  uVar11 = uVar23 + uVar20 + uVar24 + uVar11;
  Round(uVar3,uVar2,uVar1,&w0,uVar6,uVar5,uVar4,&e,0x650a73548baf63de,uVar11);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar23 = sigma1(uVar10);
  uVar24 = sigma0(uVar13);
  uVar12 = uVar23 + uVar21 + uVar24 + uVar12;
  Round(uVar4,uVar3,uVar2,&h,uVar1,uVar6,uVar5,&d,0x766a0abb3c77b2a8,uVar12);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar11);
  uVar24 = sigma0(uVar14);
  uVar13 = uVar23 + uVar22 + uVar24 + uVar13;
  Round(uVar5,uVar4,uVar3,&g,uVar2,uVar1,uVar6,&c,0x81c2c92e47edaee6,uVar13);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar12);
  uVar24 = sigma0(uVar15);
  uVar14 = uVar23 + uVar7 + uVar24 + uVar14;
  Round(uVar6,uVar5,uVar4,&f,uVar3,uVar2,uVar1,&b,0x92722c851482353b,uVar14);
  uVar6 = b;
  uVar5 = c;
  uVar4 = d;
  uVar3 = f;
  uVar2 = g;
  uVar1 = h;
  uVar23 = sigma1(uVar13);
  uVar24 = sigma0(uVar16);
  uVar15 = uVar23 + uVar8 + uVar24 + uVar15;
  Round(uVar6,uVar5,uVar4,&e,uVar3,uVar2,uVar1,&w0,0xa2bfe8a14cf10364,uVar15);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar23 = sigma1(uVar14);
  uVar24 = sigma0(uVar17);
  uVar16 = uVar23 + uVar9 + uVar24 + uVar16;
  Round(uVar1,uVar6,uVar5,&d,uVar4,uVar3,uVar2,&h,0xa81a664bbc423001,uVar16);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar15);
  uVar24 = sigma0(uVar18);
  uVar17 = uVar23 + uVar10 + uVar24 + uVar17;
  Round(uVar2,uVar1,uVar6,&c,uVar5,uVar4,uVar3,&g,0xc24b8b70d0f89791,uVar17);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar16);
  uVar24 = sigma0(uVar19);
  uVar18 = uVar23 + uVar11 + uVar24 + uVar18;
  Round(uVar3,uVar2,uVar1,&b,uVar6,uVar5,uVar4,&f,0xc76c51a30654be30,uVar18);
  uVar6 = b;
  uVar5 = c;
  uVar4 = d;
  uVar3 = f;
  uVar2 = g;
  uVar1 = h;
  uVar23 = sigma1(uVar17);
  uVar24 = sigma0(uVar20);
  uVar19 = uVar23 + uVar12 + uVar24 + uVar19;
  Round(uVar3,uVar2,uVar1,&w0,uVar6,uVar5,uVar4,&e,0xd192e819d6ef5218,uVar19);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar23 = sigma1(uVar18);
  uVar24 = sigma0(uVar21);
  uVar20 = uVar23 + uVar13 + uVar24 + uVar20;
  Round(uVar4,uVar3,uVar2,&h,uVar1,uVar6,uVar5,&d,0xd69906245565a910,uVar20);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar19);
  uVar24 = sigma0(uVar22);
  uVar21 = uVar23 + uVar14 + uVar24 + uVar21;
  Round(uVar5,uVar4,uVar3,&g,uVar2,uVar1,uVar6,&c,0xf40e35855771202a,uVar21);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar20);
  uVar24 = sigma0(uVar7);
  uVar22 = uVar23 + uVar15 + uVar24 + uVar22;
  Round(uVar6,uVar5,uVar4,&f,uVar3,uVar2,uVar1,&b,0x106aa07032bbd1b8,uVar22);
  uVar6 = b;
  uVar5 = c;
  uVar4 = d;
  uVar3 = f;
  uVar2 = g;
  uVar1 = h;
  uVar23 = sigma1(uVar21);
  uVar24 = sigma0(uVar8);
  uVar7 = uVar23 + uVar16 + uVar24 + uVar7;
  Round(uVar6,uVar5,uVar4,&e,uVar3,uVar2,uVar1,&w0,0x19a4c116b8d2d0c8,uVar7);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar23 = sigma1(uVar22);
  uVar24 = sigma0(uVar9);
  uVar8 = uVar23 + uVar17 + uVar24 + uVar8;
  Round(uVar1,uVar6,uVar5,&d,uVar4,uVar3,uVar2,&h,0x1e376c085141ab53,uVar8);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar7);
  uVar24 = sigma0(uVar10);
  uVar9 = uVar23 + uVar18 + uVar24 + uVar9;
  Round(uVar2,uVar1,uVar6,&c,uVar5,uVar4,uVar3,&g,0x2748774cdf8eeb99,uVar9);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar8);
  uVar24 = sigma0(uVar11);
  uVar10 = uVar23 + uVar19 + uVar24 + uVar10;
  Round(uVar3,uVar2,uVar1,&b,uVar6,uVar5,uVar4,&f,0x34b0bcb5e19b48a8,uVar10);
  uVar6 = b;
  uVar5 = c;
  uVar4 = d;
  uVar3 = f;
  uVar2 = g;
  uVar1 = h;
  uVar23 = sigma1(uVar9);
  uVar24 = sigma0(uVar12);
  uVar11 = uVar23 + uVar20 + uVar24 + uVar11;
  Round(uVar3,uVar2,uVar1,&w0,uVar6,uVar5,uVar4,&e,0x391c0cb3c5c95a63,uVar11);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar23 = sigma1(uVar10);
  uVar24 = sigma0(uVar13);
  uVar12 = uVar23 + uVar21 + uVar24 + uVar12;
  Round(uVar4,uVar3,uVar2,&h,uVar1,uVar6,uVar5,&d,0x4ed8aa4ae3418acb,uVar12);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar11);
  uVar24 = sigma0(uVar14);
  uVar13 = uVar23 + uVar22 + uVar24 + uVar13;
  Round(uVar5,uVar4,uVar3,&g,uVar2,uVar1,uVar6,&c,0x5b9cca4f7763e373,uVar13);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar12);
  uVar24 = sigma0(uVar15);
  uVar14 = uVar23 + uVar7 + uVar24 + uVar14;
  Round(uVar6,uVar5,uVar4,&f,uVar3,uVar2,uVar1,&b,0x682e6ff3d6b2b8a3,uVar14);
  uVar6 = b;
  uVar5 = c;
  uVar4 = d;
  uVar3 = f;
  uVar2 = g;
  uVar1 = h;
  uVar23 = sigma1(uVar13);
  uVar24 = sigma0(uVar16);
  uVar15 = uVar23 + uVar8 + uVar24 + uVar15;
  Round(uVar6,uVar5,uVar4,&e,uVar3,uVar2,uVar1,&w0,0x748f82ee5defb2fc,uVar15);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar23 = sigma1(uVar14);
  uVar24 = sigma0(uVar17);
  uVar16 = uVar23 + uVar9 + uVar24 + uVar16;
  Round(uVar1,uVar6,uVar5,&d,uVar4,uVar3,uVar2,&h,0x78a5636f43172f60,uVar16);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar15);
  uVar24 = sigma0(uVar18);
  uVar17 = uVar23 + uVar10 + uVar24 + uVar17;
  Round(uVar2,uVar1,uVar6,&c,uVar5,uVar4,uVar3,&g,0x84c87814a1f0ab72,uVar17);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar16);
  uVar24 = sigma0(uVar19);
  uVar18 = uVar23 + uVar11 + uVar24 + uVar18;
  Round(uVar3,uVar2,uVar1,&b,uVar6,uVar5,uVar4,&f,0x8cc702081a6439ec,uVar18);
  uVar6 = b;
  uVar5 = c;
  uVar4 = d;
  uVar3 = f;
  uVar2 = g;
  uVar1 = h;
  uVar23 = sigma1(uVar17);
  uVar24 = sigma0(uVar20);
  uVar19 = uVar23 + uVar12 + uVar24 + uVar19;
  Round(uVar3,uVar2,uVar1,&w0,uVar6,uVar5,uVar4,&e,0x90befffa23631e28,uVar19);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar23 = sigma1(uVar18);
  uVar24 = sigma0(uVar21);
  uVar20 = uVar23 + uVar13 + uVar24 + uVar20;
  Round(uVar4,uVar3,uVar2,&h,uVar1,uVar6,uVar5,&d,0xa4506cebde82bde9,uVar20);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar19);
  uVar24 = sigma0(uVar22);
  uVar21 = uVar23 + uVar14 + uVar24 + uVar21;
  Round(uVar5,uVar4,uVar3,&g,uVar2,uVar1,uVar6,&c,0xbef9a3f7b2c67915,uVar21);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar20);
  uVar24 = sigma0(uVar7);
  uVar22 = uVar23 + uVar15 + uVar24 + uVar22;
  Round(uVar6,uVar5,uVar4,&f,uVar3,uVar2,uVar1,&b,0xc67178f2e372532b,uVar22);
  uVar6 = b;
  uVar5 = c;
  uVar4 = d;
  uVar3 = f;
  uVar2 = g;
  uVar1 = h;
  uVar23 = sigma1(uVar21);
  uVar24 = sigma0(uVar8);
  uVar7 = uVar23 + uVar16 + uVar24 + uVar7;
  Round(uVar6,uVar5,uVar4,&e,uVar3,uVar2,uVar1,&w0,0xca273eceea26619c,uVar7);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar23 = sigma1(uVar22);
  uVar24 = sigma0(uVar9);
  uVar8 = uVar23 + uVar17 + uVar24 + uVar8;
  Round(uVar1,uVar6,uVar5,&d,uVar4,uVar3,uVar2,&h,0xd186b8c721c0c207,uVar8);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar7);
  uVar24 = sigma0(uVar10);
  uVar9 = uVar23 + uVar18 + uVar24 + uVar9;
  Round(uVar2,uVar1,uVar6,&c,uVar5,uVar4,uVar3,&g,0xeada7dd6cde0eb1e,uVar9);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar8);
  uVar24 = sigma0(uVar11);
  uVar10 = uVar23 + uVar19 + uVar24 + uVar10;
  Round(uVar3,uVar2,uVar1,&b,uVar6,uVar5,uVar4,&f,0xf57d4f7fee6ed178,uVar10);
  uVar6 = b;
  uVar5 = c;
  uVar4 = d;
  uVar3 = f;
  uVar2 = g;
  uVar1 = h;
  uVar23 = sigma1(uVar9);
  uVar24 = sigma0(uVar12);
  uVar11 = uVar23 + uVar20 + uVar24 + uVar11;
  Round(uVar3,uVar2,uVar1,&w0,uVar6,uVar5,uVar4,&e,0x6f067aa72176fba,uVar11);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar23 = sigma1(uVar10);
  uVar24 = sigma0(uVar13);
  uVar12 = uVar23 + uVar21 + uVar24 + uVar12;
  Round(uVar4,uVar3,uVar2,&h,uVar1,uVar6,uVar5,&d,0xa637dc5a2c898a6,uVar12);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar11);
  uVar24 = sigma0(uVar14);
  uVar13 = uVar23 + uVar22 + uVar24 + uVar13;
  Round(uVar5,uVar4,uVar3,&g,uVar2,uVar1,uVar6,&c,0x113f9804bef90dae,uVar13);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar12);
  uVar24 = sigma0(uVar15);
  uVar14 = uVar23 + uVar7 + uVar24 + uVar14;
  Round(uVar6,uVar5,uVar4,&f,uVar3,uVar2,uVar1,&b,0x1b710b35131c471b,uVar14);
  uVar6 = b;
  uVar5 = c;
  uVar4 = d;
  uVar3 = f;
  uVar2 = g;
  uVar1 = h;
  uVar23 = sigma1(uVar13);
  uVar24 = sigma0(uVar16);
  uVar15 = uVar23 + uVar8 + uVar24 + uVar15;
  Round(uVar6,uVar5,uVar4,&e,uVar3,uVar2,uVar1,&w0,0x28db77f523047d84,uVar15);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar23 = sigma1(uVar14);
  uVar24 = sigma0(uVar17);
  uVar16 = uVar23 + uVar9 + uVar24 + uVar16;
  Round(uVar1,uVar6,uVar5,&d,uVar4,uVar3,uVar2,&h,0x32caab7b40c72493,uVar16);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar15);
  uVar24 = sigma0(uVar18);
  uVar17 = uVar23 + uVar10 + uVar24 + uVar17;
  Round(uVar2,uVar1,uVar6,&c,uVar5,uVar4,uVar3,&g,0x3c9ebe0a15c9bebc,uVar17);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar16);
  uVar24 = sigma0(uVar19);
  uVar18 = uVar23 + uVar11 + uVar24 + uVar18;
  Round(uVar3,uVar2,uVar1,&b,uVar6,uVar5,uVar4,&f,0x431d67c49c100d4c,uVar18);
  uVar6 = b;
  uVar5 = c;
  uVar4 = d;
  uVar3 = f;
  uVar2 = g;
  uVar1 = h;
  uVar23 = sigma1(uVar17);
  uVar24 = sigma0(uVar20);
  uVar19 = uVar23 + uVar12 + uVar24 + uVar19;
  Round(uVar3,uVar2,uVar1,&w0,uVar6,uVar5,uVar4,&e,0x4cc5d4becb3e42b6,uVar19);
  uVar6 = b;
  uVar5 = c;
  uVar4 = e;
  uVar3 = f;
  uVar2 = g;
  uVar1 = w0;
  uVar23 = sigma1(uVar18);
  uVar24 = sigma0(uVar21);
  uVar20 = uVar23 + uVar13 + uVar24 + uVar20;
  Round(uVar4,uVar3,uVar2,&h,uVar1,uVar6,uVar5,&d,0x597f299cfc657e2a,uVar20);
  uVar6 = b;
  uVar5 = d;
  uVar4 = e;
  uVar3 = f;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar19);
  uVar24 = sigma0(uVar22);
  Round(uVar5,uVar4,uVar3,&g,uVar2,uVar1,uVar6,&c,0x5fcb6fab3ad6faec,
        uVar21 + uVar23 + uVar14 + uVar24);
  uVar6 = c;
  uVar5 = d;
  uVar4 = e;
  uVar3 = g;
  uVar2 = h;
  uVar1 = w0;
  uVar23 = sigma1(uVar20);
  uVar24 = sigma0(uVar7);
  Round(uVar6,uVar5,uVar4,&f,uVar3,uVar2,uVar1,&b,0x6c44198c4a475817,
        uVar22 + uVar23 + uVar15 + uVar24);
  *chunk_local = b + *chunk_local;
  chunk_local[1] = c + chunk_local[1];
  chunk_local[2] = d + chunk_local[2];
  chunk_local[3] = e + chunk_local[3];
  chunk_local[4] = f + chunk_local[4];
  chunk_local[5] = g + chunk_local[5];
  chunk_local[6] = h + chunk_local[6];
  chunk_local[7] = w0 + chunk_local[7];
  return;
}

Assistant:

static inline void Transform(uint32_t *s, const uint32_t *chunk, size_t blocks)
{
#if defined(__x86_64__) || defined(__amd64__)
	if (use_optimized_transform) {
		TransformSSE4(s, chunk, blocks);
		return;
	}
#endif
	TransformDefault(s, chunk, blocks);
}